

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

void __thiscall gutil::Exception::~Exception(Exception *this)

{
  exception *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__Exception_001c4f10;
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  std::exception::~exception(in_RDI);
  return;
}

Assistant:

virtual ~Exception() throw() { }